

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_generic.cpp
# Opt level: O1

void __thiscall mpt::metatype::generic::generic(generic *this)

{
  (this->super_metatype).super_convertable._vptr_convertable = (_func_int **)&PTR_convert_0014a960;
  (this->_ref)._val = 1;
  this->_traits = (type_traits *)0x0;
  this->_val = (void *)0x0;
  this->_type = 0;
  return;
}

Assistant:

metatype::generic::~generic()
{
	if (_val && _traits && _traits->fini) {
		_traits->fini(_val);
	}
	_val = 0;
}